

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

GLenum __thiscall
gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::ImageType<tcu::Vector<unsigned_int,4>>
          (ShaderImageLoadStoreBase *this,GLenum target)

{
  GLenum target_local;
  ShaderImageLoadStoreBase *this_local;
  
  if (target == 0xde0) {
    this_local._4_4_ = 0x9062;
  }
  else if (target == 0xde1) {
    this_local._4_4_ = 0x9063;
  }
  else if (target == 0x806f) {
    this_local._4_4_ = 0x9064;
  }
  else if (target == 0x84f5) {
    this_local._4_4_ = 0x9065;
  }
  else if (target == 0x8513) {
    this_local._4_4_ = 0x9066;
  }
  else if (target == 0x8c18) {
    this_local._4_4_ = 0x9068;
  }
  else if (target == 0x8c1a) {
    this_local._4_4_ = 0x9069;
  }
  else if (target == 0x8c2a) {
    this_local._4_4_ = 0x9067;
  }
  else if (target == 0x9009) {
    this_local._4_4_ = 0x906a;
  }
  else if (target == 0x9100) {
    this_local._4_4_ = 0x906b;
  }
  else {
    if (target != 0x9102) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                    ,0x3e3,
                    "GLenum gl4cts::(anonymous namespace)::ShaderImageLoadStoreBase::ImageType(GLenum)"
                   );
    }
    this_local._4_4_ = 0x906c;
  }
  return this_local._4_4_;
}

Assistant:

GLenum ShaderImageLoadStoreBase::ImageType<uvec4>(GLenum target)
{
	switch (target)
	{
	case GL_TEXTURE_1D:
		return GL_UNSIGNED_INT_IMAGE_1D;
	case GL_TEXTURE_2D:
		return GL_UNSIGNED_INT_IMAGE_2D;
	case GL_TEXTURE_3D:
		return GL_UNSIGNED_INT_IMAGE_3D;
	case GL_TEXTURE_RECTANGLE:
		return GL_UNSIGNED_INT_IMAGE_2D_RECT;
	case GL_TEXTURE_CUBE_MAP:
		return GL_UNSIGNED_INT_IMAGE_CUBE;
	case GL_TEXTURE_BUFFER:
		return GL_UNSIGNED_INT_IMAGE_BUFFER;
	case GL_TEXTURE_1D_ARRAY:
		return GL_UNSIGNED_INT_IMAGE_1D_ARRAY;
	case GL_TEXTURE_2D_ARRAY:
		return GL_UNSIGNED_INT_IMAGE_2D_ARRAY;
	case GL_TEXTURE_CUBE_MAP_ARRAY:
		return GL_UNSIGNED_INT_IMAGE_CUBE_MAP_ARRAY;
	case GL_TEXTURE_2D_MULTISAMPLE:
		return GL_UNSIGNED_INT_IMAGE_2D_MULTISAMPLE;
	case GL_TEXTURE_2D_MULTISAMPLE_ARRAY:
		return GL_UNSIGNED_INT_IMAGE_2D_MULTISAMPLE_ARRAY;
	}
	assert(0);
	return 0;
}